

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathStartsWithFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr obj_00;
  xmlXPathObjectPtr value;
  int iStack_20;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 2) {
    iStack_20 = 0xc;
    goto LAB_001d858c;
  }
  if (ctxt->valueNr < ctxt->valueFrame + 2) {
    iStack_20 = 0x17;
    goto LAB_001d858c;
  }
  if (ctxt->value != (xmlXPathObjectPtr)0x0) {
    if (ctxt->value->type != XPATH_STRING) {
      xmlXPathStringFunction(ctxt,1);
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
      goto LAB_001d858a;
    }
    obj = valuePop(ctxt);
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
      xmlXPathStringFunction(ctxt,1);
    }
    obj_00 = valuePop(ctxt);
    if ((obj_00 != (xmlXPathObjectPtr)0x0) && (obj_00->type == XPATH_STRING)) {
      iVar1 = xmlStrlen(obj->stringval);
      iVar1 = xmlStrncmp(obj_00->stringval,obj->stringval,iVar1);
      value = xmlXPathCacheNewBoolean(ctxt->context,(uint)(iVar1 == 0));
      valuePush(ctxt,value);
      xmlXPathReleaseObject(ctxt->context,obj_00);
      xmlXPathReleaseObject(ctxt->context,obj);
      return;
    }
    xmlXPathReleaseObject(ctxt->context,obj_00);
    xmlXPathReleaseObject(ctxt->context,obj);
  }
LAB_001d858a:
  iStack_20 = 0xb;
LAB_001d858c:
  xmlXPathErr(ctxt,iStack_20);
  return;
}

Assistant:

void
xmlXPathStartsWithFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr hay, needle;
    int n;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    needle = valuePop(ctxt);
    CAST_TO_STRING;
    hay = valuePop(ctxt);

    if ((hay == NULL) || (hay->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, hay);
	xmlXPathReleaseObject(ctxt->context, needle);
	XP_ERROR(XPATH_INVALID_TYPE);
    }
    n = xmlStrlen(needle->stringval);
    if (xmlStrncmp(hay->stringval, needle->stringval, n))
        valuePush(ctxt, xmlXPathCacheNewBoolean(ctxt->context, 0));
    else
        valuePush(ctxt, xmlXPathCacheNewBoolean(ctxt->context, 1));
    xmlXPathReleaseObject(ctxt->context, hay);
    xmlXPathReleaseObject(ctxt->context, needle);
}